

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall DomColorGroup::read(DomColorGroup *this,int __fd,void *__buf,size_t __nbytes)

{
  long lVar1;
  QStringView other;
  QStringView other_00;
  bool bVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  void *__buf_00;
  void *__buf_01;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  DomColor *v_1;
  DomColorRole *v;
  QStringView tag;
  parameter_type in_stack_ffffffffffffff08;
  DomColorRole *in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff18;
  byte in_stack_ffffffffffffff1f;
  DomColorRole *in_stack_ffffffffffffff20;
  uint in_stack_ffffffffffffff28;
  DomColorRole *in_stack_ffffffffffffff38;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    while( true ) {
      bVar2 = QXmlStreamReader::hasError((QXmlStreamReader *)0x1b644a);
      if (((bVar2 ^ 0xffU) & 1) == 0) goto LAB_001b66b5;
      iVar3 = QXmlStreamReader::readNext();
      if (iVar3 != 4) break;
      QXmlStreamReader::name();
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)CONCAT44(iVar3,in_stack_ffffffffffffff28),
                 (size_t)in_stack_ffffffffffffff20);
      QStringView::QStringView<QString,_true>
                ((QStringView *)in_stack_ffffffffffffff20,
                 (QString *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
      sVar5 = 0;
      other.m_data = (storage_type_conflict *)in_stack_ffffffffffffff38;
      other.m_size = (qsizetype)this;
      iVar4 = QStringView::compare((QStringView *)in_stack_ffffffffffffff08,other,CaseInsensitive);
      in_stack_ffffffffffffff28 = CONCAT13(iVar4 != 0,(int3)in_stack_ffffffffffffff28) ^ 0xff000000;
      QString::~QString((QString *)0x1b651c);
      if ((in_stack_ffffffffffffff28 & 0x1000000) == 0) {
        Qt::Literals::StringLiterals::operator____s
                  ((char16_t *)CONCAT44(iVar3,in_stack_ffffffffffffff28),
                   (size_t)in_stack_ffffffffffffff20);
        QStringView::QStringView<QString,_true>
                  ((QStringView *)in_stack_ffffffffffffff20,
                   (QString *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
        sVar5 = 0;
        other_00.m_data = (storage_type_conflict *)in_stack_ffffffffffffff38;
        other_00.m_size = (qsizetype)this;
        iVar3 = QStringView::compare
                          ((QStringView *)in_stack_ffffffffffffff08,other_00,CaseInsensitive);
        in_stack_ffffffffffffff1f = iVar3 != 0 ^ 0xff;
        QString::~QString((QString *)0x1b65e5);
        if ((in_stack_ffffffffffffff1f & 1) == 0) {
          in_stack_ffffffffffffff08 = (parameter_type)CONCAT44(in_register_00000034,__fd);
          Qt::Literals::StringLiterals::operator____L1
                    ((char *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),
                     (size_t)in_stack_ffffffffffffff10);
          ::operator+((QLatin1String *)in_stack_ffffffffffffff10,
                      (QStringView *)in_stack_ffffffffffffff08);
          ::QStringBuilder::operator_cast_to_QString
                    ((QStringBuilder<QLatin1String,_const_QStringView_&> *)in_stack_ffffffffffffff08
                    );
          QXmlStreamReader::raiseError(&in_stack_ffffffffffffff08->m_attr_role);
          QString::~QString((QString *)0x1b66aa);
        }
        else {
          in_stack_ffffffffffffff10 = (DomColorRole *)operator_new(0x18);
          memset(in_stack_ffffffffffffff10,0,0x18);
          DomColor::DomColor((DomColor *)in_stack_ffffffffffffff10);
          in_stack_ffffffffffffff38 = in_stack_ffffffffffffff10;
          DomColor::read((DomColor *)in_stack_ffffffffffffff10,__fd,__buf_01,sVar5);
          QList<DomColor_*>::append
                    ((QList<DomColor_*> *)0x1b6643,(parameter_type)in_stack_ffffffffffffff08);
        }
      }
      else {
        in_stack_ffffffffffffff20 = (DomColorRole *)operator_new(0x28);
        memset(in_stack_ffffffffffffff20,0,0x28);
        DomColorRole::DomColorRole(in_stack_ffffffffffffff10);
        DomColorRole::read(in_stack_ffffffffffffff20,__fd,__buf_00,sVar5);
        QList<DomColorRole_*>::append((QList<DomColorRole_*> *)0x1b657a,in_stack_ffffffffffffff08);
      }
    }
  } while (iVar3 != 5);
LAB_001b66b5:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomColorGroup::read(QXmlStreamReader &reader)
{
    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"colorrole"_s, Qt::CaseInsensitive)) {
                auto *v = new DomColorRole();
                v->read(reader);
                m_colorRole.append(v);
                continue;
            }
            if (!tag.compare(u"color"_s, Qt::CaseInsensitive)) {
                auto *v = new DomColor();
                v->read(reader);
                m_color.append(v);
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}